

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

void lua_sethook(lua_State *L,lua_Hook func,int mask,int count)

{
  CallInfo *pCVar1;
  lua_Hook p_Var2;
  CallInfo **ppCVar3;
  uint uVar4;
  
  uVar4 = mask;
  if (func == (lua_Hook)0x0) {
    uVar4 = 0;
  }
  p_Var2 = (lua_Hook)0x0;
  if (mask != 0) {
    p_Var2 = func;
  }
  L->hook = p_Var2;
  L->basehookcount = count;
  L->hookcount = count;
  L->hookmask = uVar4 & 0xff;
  if (uVar4 != 0) {
    ppCVar3 = &L->ci;
    while (pCVar1 = *ppCVar3, pCVar1 != (CallInfo *)0x0) {
      if ((pCVar1->callstatus & 0x8000) == 0) {
        (pCVar1->u).l.trap = 1;
      }
      ppCVar3 = &pCVar1->previous;
    }
  }
  return;
}

Assistant:

LUA_API void lua_sethook (lua_State *L, lua_Hook func, int mask, int count) {
  if (func == NULL || mask == 0) {  /* turn off hooks? */
    mask = 0;
    func = NULL;
  }
  L->hook = func;
  L->basehookcount = count;
  resethookcount(L);
  L->hookmask = cast_byte(mask);
  if (mask)
    settraps(L->ci);  /* to trace inside 'luaV_execute' */
}